

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

int Internal_FontDelta::Compare(Internal_FontDelta *lhs,Internal_FontDelta *rhs)

{
  int rc;
  Internal_FontDelta *rhs_local;
  Internal_FontDelta *lhs_local;
  
  if (lhs->m_candidate_font == rhs->m_candidate_font) {
    lhs_local._4_4_ = 0;
  }
  else if (rhs->m_candidate_font == (ON_Font *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else if (lhs->m_candidate_font == (ON_Font *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else {
    lhs_local._4_4_ = lhs->m_hash_delta - rhs->m_hash_delta;
    if (lhs_local._4_4_ == 0) {
      lhs_local._4_4_ = lhs->m_family_name_delta - rhs->m_family_name_delta;
      if (lhs_local._4_4_ == 0) {
        lhs_local._4_4_ = lhs->m_style_delta - rhs->m_style_delta;
        if ((((lhs_local._4_4_ == 0) &&
             (lhs_local._4_4_ = lhs->m_weight_delta - rhs->m_weight_delta, lhs_local._4_4_ == 0)) &&
            (lhs_local._4_4_ = lhs->m_stretch_delta - rhs->m_stretch_delta, lhs_local._4_4_ == 0))
           && (lhs_local._4_4_ =
                    lhs->m_underline_and_strikethrough_delta -
                    rhs->m_underline_and_strikethrough_delta, lhs_local._4_4_ == 0)) {
          lhs_local._4_4_ = 0;
        }
      }
      else if (lhs->m_family_name_delta == 0) {
        lhs_local._4_4_ = -1;
      }
      else if (rhs->m_family_name_delta == 0) {
        lhs_local._4_4_ = 1;
      }
      else if ((lhs->m_family_name_delta < 0) && (rhs->m_family_name_delta < 0)) {
        lhs_local._4_4_ = -lhs_local._4_4_;
      }
    }
  }
  return lhs_local._4_4_;
}

Assistant:

static int Compare(const Internal_FontDelta& lhs, const Internal_FontDelta& rhs)
  {
    if (lhs.m_candidate_font == rhs.m_candidate_font)
      return 0;
    if (nullptr == rhs.m_candidate_font)
      return -1; // lhs is better because it has a candidate font
    if (nullptr == lhs.m_candidate_font)
      return 1; // rhs is better because it has a candidate font

    // m_hash_delta >= 0 and smaller values of m_hash_delta indicate better matches
    int rc = (lhs.m_hash_delta - rhs.m_hash_delta);
    if (0 != rc)
      return rc;

    rc = (lhs.m_family_name_delta - rhs.m_family_name_delta);
    if (0 != rc)
    {
      if (0 == lhs.m_family_name_delta)
        return -1; // lhs is in the same family

      if (0 == rhs.m_family_name_delta)
        return 1; // rhs is in the same family

      if (lhs.m_family_name_delta < 0 && rhs.m_family_name_delta < 0)
      {
        // When both values of m_name_delta are negative, it
        // means their font family names both began with the
        // family name we are searching for. In this 
        // case the shortest tail is best.
        // The length of that tail is -m_name_delta,
        // so the least negative m_delta is the best match.
        return -rc;
      }
      // If at least one value of m_delta > 0, then the
      // smallest value of m_delta is the best match.
      return rc;
    }

    rc = (lhs.m_style_delta - rhs.m_style_delta);
    if (0 != rc)
      return rc;

    rc = (lhs.m_weight_delta - rhs.m_weight_delta);
    if (0 != rc)
      return rc;

    rc = (lhs.m_stretch_delta - rhs.m_stretch_delta);
    if (0 != rc)
      return rc;

    rc = (lhs.m_underline_and_strikethrough_delta - rhs.m_underline_and_strikethrough_delta);
    if (0 != rc)
      return rc;      

    return 0;
  }